

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::create_mac_rhs(NavierStokesBase *this,MultiFab *rhs,int nGrow,Real time,Real dt)

{
  MultiFab *src;
  undefined8 in_RDI;
  int in_XMM0_Da;
  MultiFab *mf;
  FillPatchIterator fpi;
  int nCompDsdt;
  int sCompDsdt;
  int nCompDivU;
  int sCompDivU;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  FillPatchIterator *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  MultiFab *in_stack_fffffffffffffdb0;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_fffffffffffffdb8;
  FillPatchIterator *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdd0;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  
  if (have_divu == 0) {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffd80,
               (value_type)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  }
  else {
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)0x1,(MultiFab *)0x1,in_stack_ffffffffffffffc4,
               (Real)in_stack_ffffffffffffffb8._M_t.
                     super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl
               ,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               in_XMM0_Da);
  }
  if (have_dsdt != 0) {
    amrex::FillPatchIterator::FillPatchIterator
              (in_stack_fffffffffffffdc0,(AmrLevel *)in_stack_fffffffffffffdb8._M_head_impl,
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
               (Real)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffdd0);
    src = amrex::FillPatchIterator::get_mf((FillPatchIterator *)&stack0xfffffffffffffdb8);
    amrex::MultiFab::Saxpy
              ((MultiFab *)in_stack_fffffffffffffdc0,(Real)in_stack_fffffffffffffdb8._M_head_impl,
               src,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
               in_stack_fffffffffffffda0);
    amrex::FillPatchIterator::~FillPatchIterator(in_stack_fffffffffffffd80);
  }
  return;
}

Assistant:

void
NavierStokesBase::create_mac_rhs (MultiFab& rhs, int nGrow, Real time, Real dt)
{
    BL_PROFILE("NavierStokesBase::create_mac_rhs()");

    AMREX_ASSERT(rhs.nGrow()>=nGrow);
    AMREX_ASSERT(rhs.boxArray()==grids);

    const int sCompDivU = 0;
    const int nCompDivU = 1;
    const int sCompDsdt = 0;
    const int nCompDsdt = 1;

    if (have_divu)
    {
       FillPatch(*this,rhs,nGrow,time,Divu_Type,sCompDivU,nCompDivU,sCompDivU);
    }
    else
    {
       rhs.setVal(0.);
    }

    if (have_dsdt)
    {
       FillPatchIterator fpi(*this,rhs,nGrow,time,Dsdt_Type,sCompDsdt,nCompDsdt);
       const MultiFab& mf = fpi.get_mf();
       MultiFab::Saxpy(rhs, 0.5*dt, mf, 0, sCompDsdt, nCompDsdt, nGrow);
    }
}